

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O0

bool __thiscall amrex::TagBoxArray::hasTags(TagBoxArray *this,Box *a_bx)

{
  bool bVar1;
  int iVar2;
  FabArray<amrex::TagBox> *in_RSI;
  MFIter *in_RDI;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_char> *arr;
  Box *b;
  MFIter mfi;
  bool has_tags;
  undefined4 in_stack_fffffffffffffdd8;
  undefined3 uVar3;
  MPI_Comm in_stack_fffffffffffffddc;
  MFIter *in_stack_fffffffffffffde0;
  FabArray<amrex::TagBox> *this_00;
  int local_204;
  int local_200;
  undefined4 in_stack_fffffffffffffe04;
  FabArrayBase *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  MFIter local_1b8;
  Box local_154;
  Box *local_138;
  MFIter local_130;
  byte local_c9;
  FabArray<amrex::TagBox> *local_c8;
  undefined8 local_b8;
  int local_b0;
  Box *local_a8;
  int local_a0;
  int iStack_9c;
  int local_98;
  undefined4 local_94;
  Box *local_90;
  undefined4 local_84;
  Box *local_80;
  undefined4 local_74;
  Box *local_70;
  undefined8 local_68;
  int local_60;
  Box *local_58;
  int local_50;
  int iStack_4c;
  int local_48;
  undefined4 local_44;
  IntVect *local_40;
  undefined4 local_34;
  IntVect *local_30;
  undefined4 local_24;
  IntVect *local_20;
  int local_14;
  int local_10;
  int local_c;
  MFIter *local_8;
  
  local_c9 = 0;
  local_c8 = in_RSI;
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 in_stack_fffffffffffffe08,(uchar)((uint)in_stack_fffffffffffffe04 >> 0x18));
  while (bVar1 = MFIter::isValid(&local_130), bVar1) {
    this_00 = local_c8;
    MFIter::fabbox(in_RDI);
    Box::operator&((Box *)in_stack_fffffffffffffde0,
                   (Box *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    local_138 = &local_154;
    bVar1 = Box::ok(local_138);
    if (bVar1) {
      in_stack_fffffffffffffde0 = &local_1b8;
      FabArray<amrex::TagBox>::const_array<amrex::TagBox,_0>(this_00,in_stack_fffffffffffffde0);
      local_a8 = local_138;
      local_70 = local_138;
      local_74 = 0;
      local_a0 = (local_138->smallend).vect[0];
      local_80 = local_138;
      local_84 = 1;
      iStack_9c = (local_138->smallend).vect[1];
      local_b8 = *(undefined8 *)(local_138->smallend).vect;
      local_90 = local_138;
      local_94 = 2;
      local_b0 = (local_138->smallend).vect[2];
      local_58 = local_138;
      local_20 = &local_138->bigend;
      local_24 = 0;
      local_50 = local_20->vect[0];
      local_30 = &local_138->bigend;
      local_34 = 1;
      iStack_4c = (local_138->bigend).vect[1];
      local_68 = *(undefined8 *)local_20->vect;
      local_40 = &local_138->bigend;
      local_44 = 2;
      local_60 = (local_138->bigend).vect[2];
      for (iVar2 = local_b0; local_200 = iStack_9c,
          local_1b8.local_index_map = (Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0
          , local_98 = local_b0, local_48 = local_60, iVar2 <= local_60; iVar2 = iVar2 + 1) {
        for (; local_204 = local_a0, local_200 <= iStack_4c; local_200 = local_200 + 1) {
          for (; local_204 <= local_50; local_204 = local_204 + 1) {
            uVar3 = (undefined3)in_stack_fffffffffffffddc;
            in_stack_fffffffffffffddc = CONCAT13(1,uVar3);
            if ((local_c9 & 1) == 0) {
              local_c = local_204;
              local_10 = local_200;
              in_stack_fffffffffffffddc =
                   CONCAT13(*(char *)((long)&((in_stack_fffffffffffffde0->m_fa)._M_t.
                                              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                             _M_head_impl)->_vptr_FabArrayBase +
                                     (long)(local_204 - in_stack_fffffffffffffde0->currentIndex) +
                                     (long)(local_200 - in_stack_fffffffffffffde0->beginIndex) *
                                     (long)in_stack_fffffffffffffde0->fabArray +
                                     (long)(iVar2 - in_stack_fffffffffffffde0->endIndex) *
                                     *(long *)(in_stack_fffffffffffffde0->tile_size).vect) != '\0',
                            uVar3);
              local_14 = iVar2;
              local_8 = in_stack_fffffffffffffde0;
            }
            local_c9 = (byte)((uint)in_stack_fffffffffffffddc >> 0x18);
          }
        }
      }
    }
    MFIter::operator++(&local_130);
  }
  MFIter::~MFIter(in_stack_fffffffffffffde0);
  ParallelContext::CommunicatorSub();
  ParallelAllReduce::Or((bool *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
  return (bool)(local_c9 & 1);
}

Assistant:

bool
TagBoxArray::hasTags (Box const& a_bx) const
{
    bool has_tags = false;
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        ReduceOps<ReduceOpLogicalOr> reduce_op;
        ReduceData<int> reduce_data(reduce_op);
        using ReduceTuple = typename decltype(reduce_data)::Type;

        for (MFIter mfi(*this); mfi.isValid(); ++mfi)
        {
            Box const& b = a_bx & mfi.fabbox();
            if (b.ok()) {
                const auto& arr = this->const_array(mfi);
                reduce_op.eval(b, reduce_data,
                [=] AMREX_GPU_DEVICE (int i, int j, int k) -> ReduceTuple
                {
                    int tr = arr(i,j,k) != TagBox::CLEAR;
                    return {tr};
                });
            }
        }

        ReduceTuple hv = reduce_data.value(reduce_op);
        has_tags = static_cast<bool>(amrex::get<0>(hv));
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(||:has_tags)
#endif
        for (MFIter mfi(*this); mfi.isValid(); ++mfi)
        {
            Box const& b = a_bx & mfi.fabbox();
            if (b.ok()) {
                Array4<char const> const& arr = this->const_array(mfi);
                AMREX_LOOP_3D(b, i, j, k,
                {
                    has_tags = has_tags || (arr(i,j,k) != TagBox::CLEAR);
                });
            }
        }
    }

    ParallelAllReduce::Or(has_tags, ParallelContext::CommunicatorSub());
    return has_tags;
}